

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O3

void __thiscall Application::toApp(Application *this,Message *message,SessionID *sessionID)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 *puVar3;
  DoNotSend *this_00;
  PossDupFlag possDupFlag;
  string local_a8;
  FieldBase local_88;
  
  FIX::BoolField::BoolField((BoolField *)&local_88,0x2b);
  local_88._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00151ef0;
  FIX::FieldMap::getField((FieldMap *)(message + 0x70),&local_88);
  bVar1 = FIX::BoolField::getValue((BoolField *)&local_88);
  if (!bVar1) {
    FIX::FieldBase::~FieldBase(&local_88);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    poVar2 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"OUT: ",5);
    local_88.m_tag = 0;
    local_88._12_4_ = 0;
    local_88.m_string._M_dataplus._M_p._0_1_ = 0;
    local_88._vptr_FieldBase = (_func_int **)&local_88.m_string;
    puVar3 = (undefined8 *)FIX::Message::toString((string *)message,(int)&local_88,8,9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)*puVar3,puVar3[1]);
    if ((string *)local_88._vptr_FieldBase != &local_88.m_string) {
      operator_delete(local_88._vptr_FieldBase,
                      CONCAT71(local_88.m_string._M_dataplus._M_p._1_7_,
                               local_88.m_string._M_dataplus._M_p._0_1_) + 1);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    return;
  }
  this_00 = (DoNotSend *)__cxa_allocate_exception(0x50);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
  FIX::DoNotSend::DoNotSend(this_00,&local_a8);
  __cxa_throw(this_00,&FIX::DoNotSend::typeinfo,FIX::Exception::~Exception);
}

Assistant:

EXCEPT(FIX::DoNotSend) {
  try {
    FIX::PossDupFlag possDupFlag;
    message.getHeader().getField(possDupFlag);
    if (possDupFlag) {
      throw FIX::DoNotSend();
    }
  } catch (FIX::FieldNotFound &) {}

  std::cout << std::endl << "OUT: " << message << std::endl;
}